

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O3

void __thiscall
yactfr::internal::DsPktProc::addErProc
          (DsPktProc *this,
          unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
          *erProc)

{
  __uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_> _Var1;
  pointer puVar2;
  __uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_> __ptr;
  ErProc *pEVar3;
  ErProc *__ptr_00;
  default_delete<yactfr::internal::ErProc> *this_00;
  pointer __p;
  TypeId id;
  ulong local_10;
  
  _Var1._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
  .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl =
       (tuple<yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>)
       (erProc->_M_t).
       super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
       ._M_t.
       super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
       .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl;
  local_10 = (*(EventRecordType **)
               _Var1._M_t.
               super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
               .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl)->_id;
  puVar2 = (this->_erProcsVec).
           super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_10 <
      (ulong)((long)(this->_erProcsVec).
                    super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)) {
    (erProc->_M_t).
    super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>.
    _M_t.
    super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
    .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl = (ErProc *)0x0;
    __ptr._M_t.
    super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
    .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl =
         puVar2[local_10]._M_t.
         super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
         ._M_t;
    puVar2[local_10]._M_t.
    super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>.
    _M_t = _Var1._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
           .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl;
    if ((_Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
         )__ptr._M_t.
          super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
          .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl != (ErProc *)0x0) {
      std::default_delete<yactfr::internal::ErProc>::operator()
                ((default_delete<yactfr::internal::ErProc> *)(puVar2 + local_10),
                 (ErProc *)
                 __ptr._M_t.
                 super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
                 .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl);
      return;
    }
  }
  else {
    this_00 = (default_delete<yactfr::internal::ErProc> *)
              std::__detail::
              _Map_base<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->_erProcsMap,&local_10);
    pEVar3 = (erProc->_M_t).
             super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
             ._M_t.
             super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
             .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl;
    (erProc->_M_t).
    super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>.
    _M_t.
    super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
    .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl = (ErProc *)0x0;
    __ptr_00 = *(ErProc **)this_00;
    *(ErProc **)this_00 = pEVar3;
    if (__ptr_00 != (ErProc *)0x0) {
      std::default_delete<yactfr::internal::ErProc>::operator()(this_00,__ptr_00);
    }
  }
  return;
}

Assistant:

void DsPktProc::addErProc(std::unique_ptr<ErProc> erProc)
{
    const auto id = erProc->ert().id();

    if (id < _erProcsVec.size()) {
        _erProcsVec[id] = std::move(erProc);
    } else {
        _erProcsMap[id] = std::move(erProc);
    }
}